

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O2

REF_STATUS ref_subdiv_inspect_cell(REF_SUBDIV ref_subdiv,REF_CELL ref_cell,REF_INT cell)

{
  REF_NODE pRVar1;
  REF_INT *pRVar2;
  long lVar3;
  REF_INT RVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  pRVar1 = ref_subdiv->grid->node;
  for (iVar7 = 0; iVar7 < ref_cell->edge_per; iVar7 = iVar7 + 1) {
    pRVar2 = ref_subdiv->mark;
    RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,iVar7,cell);
    printf(" %d",(ulong)(uint)pRVar2[RVar4]);
  }
  printf(" cell %d rank %d",(ulong)(uint)cell,(ulong)(uint)ref_subdiv->grid->mpi->id);
  lVar3 = -1;
  for (lVar5 = 0; (int)lVar5 < ref_cell->node_per; lVar5 = lVar5 + 1) {
    iVar7 = ref_cell->c2n[(long)ref_cell->size_per * (long)cell + lVar5];
    lVar6 = lVar3;
    if ((-1 < (long)iVar7) && (iVar7 < pRVar1->max)) {
      lVar6 = pRVar1->global[iVar7];
      if (lVar6 < 0) {
        lVar6 = lVar3;
      }
    }
    printf(" %ld",lVar6);
  }
  putchar(10);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_inspect_cell(REF_SUBDIV ref_subdiv,
                                           REF_CELL ref_cell, REF_INT cell) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_INT cell_node, edge;

  for (edge = 0; edge < ref_cell_edge_per(ref_cell); edge++) {
    printf(" %d",
           ref_subdiv_mark(ref_subdiv,
                           ref_subdiv_c2e(ref_subdiv, ref_cell, edge, cell)));
  }
  printf(" cell %d rank %d", cell, ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)));
  each_ref_cell_cell_node(ref_cell, cell_node) {
    printf(" " REF_GLOB_FMT,
           ref_node_global(ref_node, ref_cell_c2n(ref_cell, cell_node, cell)));
  }
  printf("\n");

  return REF_SUCCESS;
}